

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O0

bool __thiscall Clasp::ClaspFacade::SolveHandle::error(SolveHandle *this)

{
  bool bVar1;
  undefined1 local_9;
  
  bVar1 = ready((SolveHandle *)0x122677);
  local_9 = false;
  if (bVar1) {
    local_9 = SolveStrategy::error((SolveStrategy *)0x122692);
  }
  return local_9;
}

Assistant:

bool ClaspFacade::SolveHandle::error()              const { return ready() && strat_->error(); }